

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  __pid_t _Var1;
  int iVar2;
  stringstream *local_270;
  ifstream file;
  size_type *local_68;
  string dummy;
  string filename;
  
  Message::Message((Message *)&local_270);
  std::operator<<((ostream *)(local_270 + 0x10),"/proc/");
  _Var1 = getpid();
  std::ostream::operator<<(local_270 + 0x10,_Var1);
  std::operator<<((ostream *)(local_270 + 0x10),"/stat");
  StringStreamToString((string *)((long)&dummy.field_2 + 8),local_270);
  if (local_270 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_270 + 8))();
  }
  local_68 = &dummy._M_string_length;
  dummy._M_dataplus._M_p = (pointer)0x0;
  dummy._M_string_length._0_1_ = 0;
  std::ifstream::ifstream(&local_270,(char *)dummy.field_2._8_8_,_S_in);
  iVar2 = -0x14;
  while (iVar2 = iVar2 + 1, iVar2 != 0) {
    std::operator>>((istream *)&local_270,(string *)&local_68);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)&local_270);
  std::ifstream::~ifstream(&local_270);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(dummy.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}